

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
LDPC4QKD::read_rate_adaption_from_csv<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          string *file_path)

{
  istream *piVar1;
  const_reference pvVar2;
  runtime_error *this;
  string current_line;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_of_two;
  ifstream fs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fs,(string *)file_path,_S_in);
  if ((abStack_218[*(long *)(_fs + -0x18)] & 5) == 0) {
    current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
    current_line._M_string_length = 0;
    current_line.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fs,(string *)&current_line);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      HelpersReadFilesLDPC::helper_parse_sep_ints<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &vec_of_two.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 &current_line,',');
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &vec_of_two.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,pvVar2);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &vec_of_two.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,pvVar2);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&vec_of_two.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    std::__cxx11::string::~string((string *)&current_line);
    std::ifstream::~ifstream(&fs);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Stream object invalid.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<rowidx> read_rate_adaption_from_csv(const std::string &file_path) {
        try {
            std::ifstream fs(file_path);
            if (!fs) {
                throw std::runtime_error("Stream object invalid.");
            }

            std::string current_line;

            std::vector<rowidx> rows_to_combine{};

            while(getline(fs, current_line)) {
                const auto vec_of_two = HelpersReadFilesLDPC::helper_parse_sep_ints<rowidx>(current_line, ',');
                rows_to_combine.push_back(vec_of_two.at(0));
                rows_to_combine.push_back(vec_of_two.at(1));
            }

            return rows_to_combine;
        }
        catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read rate adaption from file '" << file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        }
        catch (...) {
            std::stringstream s;
            s << "Failed to read read rate adaption from file '" << file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }